

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassNameSyntax,slang::parsing::Token&,slang::syntax::ParameterValueAssignmentSyntax&>
          (BumpAllocator *this,Token *args,ParameterValueAssignmentSyntax *args_1)

{
  Token identifier;
  ClassNameSyntax *pCVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pCVar1 = (ClassNameSyntax *)allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  identifier.info = in_RSI;
  identifier._0_8_ = in_RDX;
  slang::syntax::ClassNameSyntax::ClassNameSyntax
            ((ClassNameSyntax *)in_RSI->location,identifier,
             (ParameterValueAssignmentSyntax *)in_RSI->rawTextPtr);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }